

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusAnalyzerSettings.cpp
# Opt level: O0

void __thiscall SMBusAnalyzerSettings::SMBusAnalyzerSettings(SMBusAnalyzerSettings *this)

{
  SMBusAnalyzerSettings *this_local;
  
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__SMBusAnalyzerSettings_00131558;
  Channel::Channel(&this->mSMBDAT,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  Channel::Channel(&this->mSMBCLK,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  this->mDecodeLevel = DL_Signals;
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(&this->mSMBDATInterface);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(&this->mSMBCLKInterface);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList
            (&this->mDecodeLevelInterface);
  AnalyzerSettingInterfaceBool::AnalyzerSettingInterfaceBool(&this->mCalculatePECInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)&this->mSMBDATInterface,"SMBDAT");
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)&this->mSMBDATInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)&this->mSMBCLKInterface,"SMBCLK");
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)&this->mSMBCLKInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip
            ((char *)&this->mDecodeLevelInterface,"SMBus decode level");
  AnalyzerSettingInterfaceNumberList::AddNumber(0.0,(char *)&this->mDecodeLevelInterface,"Signals");
  AnalyzerSettingInterfaceNumberList::AddNumber(1.0,(char *)&this->mDecodeLevelInterface,"Bytes");
  AnalyzerSettingInterfaceNumberList::AddNumber(2.0,(char *)&this->mDecodeLevelInterface,"SMBus");
  AnalyzerSettingInterfaceNumberList::AddNumber(3.0,(char *)&this->mDecodeLevelInterface,"PMBus");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (4.0,(char *)&this->mDecodeLevelInterface,"Smart Battery");
  AnalyzerSettingInterfaceNumberList::SetNumber(0.0);
  AnalyzerSettingInterfaceBool::SetValue((bool)((char)this + -0x80));
  AnalyzerSettingInterface::SetTitleAndTooltip
            ((char *)&this->mCalculatePECInterface,"Calculate PEC on packets");
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddExportOption((uint)this,(char *)0x0);
  AnalyzerSettings::AddExportExtension((uint)this,(char *)0x0,"text");
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mSMBDAT,true);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mSMBCLK,true);
  return;
}

Assistant:

SMBusAnalyzerSettings::SMBusAnalyzerSettings() : mSMBDAT( UNDEFINED_CHANNEL ), mSMBCLK( UNDEFINED_CHANNEL ), mDecodeLevel( DL_Signals )
{
    // init the interface
    mSMBDATInterface.SetTitleAndTooltip( "SMBDAT", "SMBus data line" );
    mSMBDATInterface.SetChannel( mSMBDAT );

    mSMBCLKInterface.SetTitleAndTooltip( "SMBCLK", "SMBus clock line" );
    mSMBCLKInterface.SetChannel( mSMBCLK );

    mDecodeLevelInterface.SetTitleAndTooltip( "SMBus decode level", "Type of decoded SMBus data" );
    mDecodeLevelInterface.AddNumber( DL_Signals, "Signals", "Decode the signal states" );
    mDecodeLevelInterface.AddNumber( DL_Bytes, "Bytes", "Decode the data as raw bytes" );
    mDecodeLevelInterface.AddNumber( DL_SMBus, "SMBus", "Decode SMBus basic protocol" );
    mDecodeLevelInterface.AddNumber( DL_PMBus, "PMBus", "Decode PMBus commands" );
    mDecodeLevelInterface.AddNumber( DL_SmartBattery, "Smart Battery", "Decode Smart Battery commands" );

    mDecodeLevelInterface.SetNumber( DL_Signals );

    mCalculatePECInterface.SetValue( true );
    mCalculatePECInterface.SetTitleAndTooltip( "Calculate PEC on packets", "true - calculate PEC, false - no PEC on packets" );

    // add the interfaces
    AddInterface( &mSMBDATInterface );
    AddInterface( &mSMBCLKInterface );
    AddInterface( &mDecodeLevelInterface );
    AddInterface( &mCalculatePECInterface );

    // describe export
    AddExportOption( 0, "Export as text file" );
    AddExportExtension( 0, "text", "txt" );

    ClearChannels();

    AddChannel( mSMBDAT, "SMBDAT", false );
    AddChannel( mSMBCLK, "SMBCLK", false );
}